

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function_catalog_entry.cpp
# Opt level: O1

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::ScalarFunctionCatalogEntry::AlterEntry
          (ScalarFunctionCatalogEntry *this,CatalogTransaction transaction,AlterInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  vector<duckdb::FunctionDescription,std::allocator<duckdb::FunctionDescription>> *this_00;
  long lVar3;
  pointer pcVar4;
  pointer pFVar5;
  Catalog *catalog;
  SchemaCatalogEntry *schema;
  size_type sVar6;
  bool bVar7;
  pointer pCVar8;
  ScalarFunctionCatalogEntry *this_01;
  InternalException *pIVar9;
  BinderException *this_02;
  long in_RDX;
  unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
  *this_03;
  CreateScalarFunctionInfo new_info;
  FunctionSet<duckdb::ScalarFunction> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  FunctionSet<duckdb::ScalarFunction> local_258;
  ScalarFunctionSet local_220;
  undefined1 local_1e8 [368];
  pointer local_78;
  _Alloc_hider local_68;
  char local_58 [16];
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> local_48;
  
  if (*(char *)(in_RDX + 9) != '\x05') {
    pIVar9 = (InternalException *)__cxa_allocate_exception(0x10);
    local_1e8._0_8_ = local_1e8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,
               "Attempting to alter ScalarFunctionCatalogEntry with unsupported alter type","");
    InternalException::InternalException(pIVar9,(string *)local_1e8);
    __cxa_throw(pIVar9,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(char *)(in_RDX + 0x71) == '\x01') {
    local_2b0.name._M_dataplus._M_p = (pointer)&local_2b0.name.field_2;
    lVar3 = *(long *)((long)&info[2].name.field_2 + 8);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,lVar3,*(long *)&info[2].allow_internal + lVar3);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::vector
              (&local_2b0.functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
               &info[3].catalog);
    this_03 = (unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
               *)(in_RDX + 0x78);
    pCVar8 = unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
             ::operator->(this_03);
    paVar1 = &local_258.name.field_2;
    pcVar4 = (pCVar8->functions).super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p;
    local_258.name._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar4,
               pcVar4 + (pCVar8->functions).super_FunctionSet<duckdb::ScalarFunction>.name.
                        _M_string_length);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::vector
              (&local_258.functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &(pCVar8->functions).super_FunctionSet<duckdb::ScalarFunction>.functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
    bVar7 = FunctionSet<duckdb::ScalarFunction>::MergeFunctionSet(&local_2b0,&local_258,true);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
              (&local_258.functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_258.name._M_dataplus._M_p);
    }
    paVar1 = &local_2b0.name.field_2;
    if (bVar7) {
      paVar2 = &local_220.super_FunctionSet<duckdb::ScalarFunction>.name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.name._M_dataplus._M_p == paVar1) {
        local_220.super_FunctionSet<duckdb::ScalarFunction>.name.field_2._8_8_ =
             local_2b0.name.field_2._8_8_;
        local_220.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_220.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p =
             local_2b0.name._M_dataplus._M_p;
      }
      local_220.super_FunctionSet<duckdb::ScalarFunction>.name._M_string_length =
           local_2b0.name._M_string_length;
      local_2b0.name._M_string_length = 0;
      local_2b0.name.field_2._M_local_buf[0] = '\0';
      local_220.super_FunctionSet<duckdb::ScalarFunction>.functions.
      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_2b0.functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_220.super_FunctionSet<duckdb::ScalarFunction>.functions.
      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2b0.functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_220.super_FunctionSet<duckdb::ScalarFunction>.functions.
      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_2b0.functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2b0.functions.
      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b0.functions.
      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b0.functions.
      super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
      super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b0.name._M_dataplus._M_p = (pointer)paVar1;
      CreateScalarFunctionInfo::CreateScalarFunctionInfo
                ((CreateScalarFunctionInfo *)local_1e8,&local_220);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
                (&local_220.super_FunctionSet<duckdb::ScalarFunction>.functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_220.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p);
      }
      local_1e8[0x52] = (info->schema).field_2._M_local_buf[2];
      this_00 = (vector<duckdb::FunctionDescription,std::allocator<duckdb::FunctionDescription>> *)
                (local_1e8 + 0x168);
      ::std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::
      operator=((vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_> *
                )this_00,(vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                          *)&info[2].name);
      pCVar8 = unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
               ::operator->(this_03);
      pFVar5 = (pCVar8->super_CreateFunctionInfo).descriptions.
               super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
               .
               super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar8 = unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
               ::operator->(this_03);
      ::std::vector<duckdb::FunctionDescription,std::allocator<duckdb::FunctionDescription>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::FunctionDescription*,std::vector<duckdb::FunctionDescription,std::allocator<duckdb::FunctionDescription>>>>
                (this_00,local_78,pFVar5,
                 (pCVar8->super_CreateFunctionInfo).descriptions.
                 super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                 .
                 super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      catalog = (Catalog *)info[1].name.field_2._M_allocated_capacity;
      schema = *(SchemaCatalogEntry **)((long)&info[1].name.field_2 + 8);
      this_01 = (ScalarFunctionCatalogEntry *)operator_new(400);
      ScalarFunctionCatalogEntry(this_01,catalog,schema,(CreateScalarFunctionInfo *)local_1e8);
      (this->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
      _vptr_CatalogEntry = (_func_int **)this_01;
      local_1e8._0_8_ = &PTR__CreateScalarFunctionInfo_0247dbf8;
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
                (&local_48);
      if (local_68._M_p != local_58) {
        operator_delete(local_68._M_p);
      }
      local_1e8._0_8_ = &PTR__CreateFunctionInfo_0247e180;
      ::std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::
      ~vector((vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_> *)
              this_00);
      if ((undefined1 *)local_1e8._328_8_ != local_1e8 + 0x158) {
        operator_delete((void *)local_1e8._328_8_);
      }
      if ((undefined1 *)local_1e8._296_8_ != local_1e8 + 0x138) {
        operator_delete((void *)local_1e8._296_8_);
      }
      CreateInfo::~CreateInfo((CreateInfo *)local_1e8);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
                (&local_2b0.functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0.name._M_dataplus._M_p != &local_2b0.name.field_2) {
        operator_delete(local_2b0.name._M_dataplus._M_p);
      }
      return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
    }
    this_02 = (BinderException *)__cxa_allocate_exception(0x10);
    local_1e8._0_8_ = local_1e8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,
               "Failed to add new function overloads to function \"%s\": function overload already exists"
               ,"");
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    sVar6 = (info->catalog).field_2._M_allocated_capacity;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,sVar6,*(long *)((long)&(info->catalog).field_2 + 8) + sVar6);
    BinderException::BinderException<std::__cxx11::string>(this_02,(string *)local_1e8,&local_278);
    __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar9 = (InternalException *)__cxa_allocate_exception(0x10);
  local_1e8._0_8_ = local_1e8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,
             "Attempting to alter ScalarFunctionCatalogEntry with unsupported alter scalar function type"
             ,"");
  InternalException::InternalException(pIVar9,(string *)local_1e8);
  __cxa_throw(pIVar9,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CatalogEntry> ScalarFunctionCatalogEntry::AlterEntry(CatalogTransaction transaction, AlterInfo &info) {
	if (info.type != AlterType::ALTER_SCALAR_FUNCTION) {
		throw InternalException("Attempting to alter ScalarFunctionCatalogEntry with unsupported alter type");
	}
	auto &function_info = info.Cast<AlterScalarFunctionInfo>();
	if (function_info.alter_scalar_function_type != AlterScalarFunctionType::ADD_FUNCTION_OVERLOADS) {
		throw InternalException(
		    "Attempting to alter ScalarFunctionCatalogEntry with unsupported alter scalar function type");
	}
	auto &add_overloads = function_info.Cast<AddScalarFunctionOverloadInfo>();

	ScalarFunctionSet new_set = functions;
	if (!new_set.MergeFunctionSet(add_overloads.new_overloads->functions, true)) {
		throw BinderException(
		    "Failed to add new function overloads to function \"%s\": function overload already exists", name);
	}
	CreateScalarFunctionInfo new_info(std::move(new_set));
	new_info.internal = internal;
	new_info.descriptions = descriptions;
	new_info.descriptions.insert(new_info.descriptions.end(), add_overloads.new_overloads->descriptions.begin(),
	                             add_overloads.new_overloads->descriptions.end());
	return make_uniq<ScalarFunctionCatalogEntry>(catalog, schema, new_info);
}